

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

void __thiscall
cppcms::url_mapper::data::map
          (data *this,string_key *key,string_key *full_url,streamable **params,size_t params_no,
          map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data_helpers_default,
          map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data_helpers_override,ostream *out)

{
  url_mapper *this_00;
  string_key *in_RCX;
  string_key *in_RDX;
  data *in_RSI;
  data *in_RDI;
  streamable **in_R8;
  size_t in_R9;
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *unaff_retaddr;
  ostream *in_stack_00000008;
  ostream *in_stack_00000010;
  streamable *par_ptr;
  streamable stream_url;
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> url;
  entry *formatting;
  string *in_stack_fffffffffffffef8;
  string_key *in_stack_ffffffffffffff00;
  streamable *in_stack_ffffffffffffff20;
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> local_88;
  entry *data_helpers_default_00;
  
  local_88.data_helpers_override =
       (map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)get_entry((data *)params_no,(string_key *)data_helpers_default,(size_t)formatting,
                    (string_key *)url.data_helpers_override);
  if (in_RDI->parent == (application *)0x0) {
    std::operator<<(in_stack_00000010,(string *)&in_RDI->root);
    write(in_RDI,(int)local_88.data_helpers_override,in_RCX,(size_t)in_R8);
  }
  else {
    data_helpers_default_00 = (entry *)local_88.data_helpers_override;
    filters::streamable::
    streamable<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
              (in_stack_ffffffffffffff20,&local_88);
    this_00 = application::mapper((application *)0x3be59b);
    booster::hold_ptr<cppcms::url_mapper::data>::operator->(&this_00->d);
    string_key::string_key(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    map(in_RSI,in_RDX,in_RCX,in_R8,in_R9,
        (map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)data_helpers_default_00,unaff_retaddr,in_stack_00000008);
    string_key::~string_key((string_key *)0x3be618);
    filters::streamable::~streamable((streamable *)&local_88);
  }
  return;
}

Assistant:

void map(	string_key const &key,
				string_key const &full_url,
				filters::streamable const * const *params,
				size_t params_no,
				std::map<string_key,std::string> const &data_helpers_default,
				std::map<string_key,std::string> const &data_helpers_override,
				std::ostream &out) const
		{
			entry const &formatting = get_entry(key,params_no,full_url);

			if(parent) {
				stream_it<data,entry> url = 
				{ 
					this,
					&formatting,
					params,
					params_no,
					&data_helpers_default,
					&data_helpers_override
				};

				filters::streamable stream_url(url);
				filters::streamable const *par_ptr=&stream_url;
				parent->mapper().d->map(this_name,full_url,&par_ptr,1,	data_helpers_default,
											data_helpers_override,out);
			}
			else {
				out << root;
				write(formatting,params,params_no,data_helpers_default,data_helpers_override,out);
			}

		}